

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
KickBanIRCCommand::trigger
          (KickBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  Server **server;
  long *plVar6;
  string local_c0;
  size_t local_a0;
  string banner;
  long *local_78;
  long *local_70;
  string_view nick_local;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  
  nick_local._M_str = nick._M_str;
  nick_local._M_len = nick._M_len;
  pcVar2 = channel._M_str;
  sVar3 = channel._M_len;
  if (parameters._M_len != 0) {
    lVar1 = Jupiter::IRC::Client::getChannel(source,sVar3,pcVar2);
    if (lVar1 != 0) {
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)&local_78);
      if (local_70 == local_78) {
        Jupiter::IRC::Client::sendMessage
                  (source,sVar3,pcVar2,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      else {
        banner._M_dataplus._M_p = (pointer)parameters._M_len;
        banner._M_string_length = (size_type)parameters._M_str;
        local_c0._M_dataplus._M_p = (pointer)0x2;
        local_c0._M_string_length = 0x13bb6d;
        jessilib::
        word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                  (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)&banner,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_c0);
        name._M_str = command_split.first._M_str;
        name._M_len = command_split.first._M_len;
        local_a0 = 9;
        if (command_split.second._M_len != 0) {
          local_a0 = command_split.second._M_len;
        }
        pcVar4 = "No reason";
        if (command_split.second._M_len != 0) {
          pcVar4 = command_split.second._M_str;
        }
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&banner,&nick_local,(allocator<char> *)&local_c0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&banner,"@IRC");
        uVar5 = 0;
        for (plVar6 = local_78; plVar6 != local_70; plVar6 = plVar6 + 1) {
          if (*plVar6 != 0) {
            lVar1 = RenX::Server::getPlayerByPartName
                              (*plVar6,command_split.first._M_len,command_split.first._M_str);
            if (lVar1 != 0) {
              RenX::Server::banPlayer
                        (*plVar6,lVar1,banner._M_string_length,banner._M_dataplus._M_p,local_a0,
                         pcVar4,0);
              uVar5 = uVar5 + 1;
            }
          }
        }
        if (uVar5 == 0) {
          player_not_found_message_abi_cxx11_(&local_c0,name);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar3,pcVar2,local_c0._M_string_length,local_c0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        else {
          string_printf_abi_cxx11_(&local_c0,"%u players kicked.",(ulong)uVar5);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar3,pcVar2,local_c0._M_string_length,local_c0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_c0);
          RenX::getCore();
          RenX::Core::banCheck();
        }
        std::__cxx11::string::~string((string *)&banner);
      }
      std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
                ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_78);
    }
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (source,nick_local._M_len,nick_local._M_str,0x3c,
             "Error: Too Few Parameters. Syntax: KickBan <Player> [Reason]");
  return;
}

Assistant:

void KickBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			const auto& servers = RenX::getCore()->getServers(chan->getType());
			if (servers.size() != 0)
			{
				RenX::PlayerInfo *player;
				unsigned int kicks = 0;
				auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
				std::string_view name = command_split.first;
				std::string_view reason = command_split.second;
				if (reason.empty()) {
					reason = "No reason"sv;
				}

				std::string banner{ nick };
				banner += "@IRC";
				for (const auto& server : servers) {
					if (server != nullptr) {
						player = server->getPlayerByPartName(name);
						if (player != nullptr) {
							server->banPlayer(*player, banner, reason);
							kicks++;
						}
					}
				}
				if (kicks == 0) {
					source->sendMessage(channel, player_not_found_message(name));
				}
				else {
					source->sendMessage(channel, string_printf("%u players kicked.", kicks));
					RenX::getCore()->banCheck();
				}
			}
			else source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: KickBan <Player> [Reason]"sv);
}